

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O0

void __thiscall
chaiscript::Type_Conversions::add_conversion
          (Type_Conversions *this,shared_ptr<chaiscript::detail::Type_Conversion_Base> *conversion)

{
  initializer_list<const_std::type_info_*> __l;
  element_type *peVar1;
  Type_Info *pTVar2;
  type_info *this_00;
  type_info *ptVar3;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_bool>
  pVar4;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  shared_mutex *in_stack_ffffffffffffff58;
  unique_lock<chaiscript::detail::threading::shared_mutex> *in_stack_ffffffffffffff60;
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  *this_01;
  value_type *in_stack_ffffffffffffff78;
  set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
  *in_stack_ffffffffffffff80;
  type_info *local_60;
  undefined1 local_58 [16];
  _Base_ptr local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  
  chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex>::
  unique_lock(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pVar4 = std::
          set<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
          ::insert(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_40 = (_Base_ptr)pVar4.first._M_node;
  local_38 = pVar4.second;
  peVar1 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2d2b4f);
  pTVar2 = chaiscript::detail::Type_Conversion_Base::to(peVar1);
  this_00 = Type_Info::bare_type_info(pTVar2);
  this_01 = (set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
             *)local_58;
  local_60 = this_00;
  peVar1 = std::
           __shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2d2b90);
  pTVar2 = chaiscript::detail::Type_Conversion_Base::from(peVar1);
  ptVar3 = Type_Info::bare_type_info(pTVar2);
  *(type_info **)&(this_01->_M_t)._M_impl = ptVar3;
  local_58._8_8_ = &local_60;
  local_48 = (_Base_ptr)0x2;
  __l._M_len = (size_type)this_00;
  __l._M_array = &pTVar2->m_type_info;
  std::
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  ::insert(this_01,__l);
  std::
  set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
  ::size((set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>
          *)0x2d2bf2);
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)this_00,(__int_type_conflict1)pTVar2);
  chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex>::
  ~unique_lock((unique_lock<chaiscript::detail::threading::shared_mutex> *)0x2d2c13);
  return;
}

Assistant:

void add_conversion(const std::shared_ptr<detail::Type_Conversion_Base> &conversion)
      {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        /// \todo error if a conversion already exists
        m_conversions.insert(conversion);
        m_convertableTypes.insert({conversion->to().bare_type_info(), conversion->from().bare_type_info()});
        m_num_types = m_convertableTypes.size();
      }